

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressSequences_bmi2
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  BYTE BVar4;
  BYTE *pBVar5;
  uint uVar6;
  seq_t sequence;
  bool bVar7;
  BYTE *op_2;
  long lVar8;
  ZSTD_DCtx *pZVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  uint uVar12;
  int iVar13;
  BYTE *pBVar14;
  ulong uVar15;
  ulong uVar16;
  ZSTD_DCtx *pZVar17;
  BYTE *ip_1;
  BYTE *pBVar18;
  BYTE *litPtr;
  seqState_t seqState;
  BYTE *local_130;
  BIT_DStream_t local_128;
  ZSTD_fseState local_100;
  ZSTD_fseState local_f0;
  ZSTD_fseState local_e0;
  ulong local_d0 [6];
  BYTE *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  ulong local_80;
  size_t sStack_78;
  ulong local_70;
  BYTE *pBStack_68;
  BYTE *local_60;
  BYTE *local_58;
  ZSTD_DCtx *local_50;
  BYTE *local_48;
  void *local_40;
  ZSTD_DCtx *local_38;
  
  local_a0 = (BYTE *)(maxDstSize + (long)dst);
  local_130 = dctx->litPtr;
  pBVar18 = local_130 + dctx->litSize;
  local_40 = dst;
  if (nbSeq == 0) goto LAB_00152009;
  pBVar5 = (BYTE *)dctx->prefixStart;
  local_58 = (BYTE *)dctx->virtualStart;
  local_60 = (BYTE *)dctx->dictEnd;
  dctx->fseEntropy = 1;
  lVar8 = -0xc;
  do {
    *(ulong *)((long)local_d0 + lVar8 * 2 + 0x18) = (ulong)*(uint *)((long)dctx->workspace + lVar8);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0);
  if (seqSize == 0) {
    local_128.ptr = (char *)0x0;
    local_128.start = (char *)0x0;
    local_128.bitContainer = 0;
    local_128._8_8_ = 0;
    local_128.limitPtr = (char *)0x0;
LAB_00151897:
    bVar7 = false;
    pZVar9 = (ZSTD_DCtx *)0xffffffffffffffec;
  }
  else {
    local_128.limitPtr = (char *)((long)seqStart + 8);
    local_128.start = (char *)seqStart;
    if (seqSize < 8) {
      local_128.bitContainer = (size_t)*seqStart;
      switch(seqSize) {
      case 7:
        local_128.bitContainer =
             (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_128.bitContainer;
      case 6:
        local_128.bitContainer =
             local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
      case 5:
        local_128.bitContainer =
             local_128.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
      case 4:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
      case 3:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
      case 2:
        local_128.bitContainer =
             local_128.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
      }
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar6 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      local_128.bitsConsumed = ~uVar6 + 9;
      if (bVar1 == 0) {
        local_128.bitsConsumed = 0;
      }
      local_128.ptr = (char *)seqStart;
      if (bVar1 == 0) goto LAB_00151897;
      local_128.bitsConsumed = local_128.bitsConsumed + (int)seqSize * -8 + 0x40;
    }
    else {
      local_128.ptr = (char *)((long)seqStart + (seqSize - 8));
      local_128.bitContainer = *(size_t *)local_128.ptr;
      bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
      uVar6 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      local_128.bitsConsumed = ~uVar6 + 9;
      if (bVar1 == 0) {
        local_128.bitsConsumed = 0;
      }
      if (bVar1 == 0 || 0xffffffffffffff88 < seqSize) goto LAB_00151897;
    }
    local_98 = pBVar5;
    local_88 = pBVar18;
    ZSTD_initFseState(&local_100,&local_128,dctx->LLTptr);
    ZSTD_initFseState(&local_f0,&local_128,dctx->OFTptr);
    local_50 = dctx;
    ZSTD_initFseState(&local_e0,&local_128,dctx->MLTptr);
    local_90 = local_a0 + -8;
    local_48 = local_a0 + -0xd;
    do {
      pBVar18 = local_98;
      uVar15 = local_d0[1];
      uVar6 = local_128.bitsConsumed;
      iVar13 = (int)local_128.start;
      if (local_128.bitsConsumed < 0x41) {
        if (local_128.ptr < local_128.limitPtr) {
          if (local_128.ptr == local_128.start) goto LAB_00151a2c;
          uVar16 = (ulong)(uint)((int)local_128.ptr - iVar13);
          if (local_128.start <=
              (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
            uVar16 = (ulong)(local_128.bitsConsumed >> 3);
          }
          uVar12 = local_128.bitsConsumed + (int)uVar16 * -8;
        }
        else {
          uVar16 = (ulong)(local_128.bitsConsumed >> 3);
          uVar12 = local_128.bitsConsumed & 7;
        }
        local_128.ptr = (char *)((long)local_128.ptr - uVar16);
        local_128.bitsConsumed = uVar12;
        local_128.bitContainer = *(size_t *)local_128.ptr;
      }
LAB_00151a2c:
      if ((0x40 < uVar6) || (nbSeq == 0)) {
        pBVar18 = local_88;
        if (nbSeq == 0) {
          if (local_128.bitsConsumed < 0x41) {
            if (local_128.ptr < local_128.limitPtr) {
              if (local_128.ptr == local_128.start) {
                if (local_128.bitsConsumed != 0x40) goto LAB_00151fbf;
                goto LAB_00151fea;
              }
              uVar15 = (ulong)(uint)((int)local_128.ptr - iVar13);
              if (local_128.start <=
                  (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
                uVar15 = (ulong)(local_128.bitsConsumed >> 3);
              }
              local_128.bitsConsumed = local_128.bitsConsumed + (int)uVar15 * -8;
            }
            else {
              uVar15 = (ulong)(local_128.bitsConsumed >> 3);
              local_128.bitsConsumed = local_128.bitsConsumed & 7;
            }
            local_128.ptr = (char *)((long)local_128.ptr - uVar15);
            local_128.bitContainer = *(size_t *)local_128.ptr;
            goto LAB_00151fbf;
          }
LAB_00151fea:
          lVar8 = 0;
          do {
            (local_50->entropy).rep[lVar8] = (U32)local_d0[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          bVar7 = true;
          pZVar9 = dctx;
        }
        else {
LAB_00151fbf:
          bVar7 = false;
          pZVar9 = (ZSTD_DCtx *)0xffffffffffffffec;
        }
        break;
      }
      local_38 = dctx;
      bVar1 = local_100.table[local_100.state].nbAdditionalBits;
      bVar2 = local_e0.table[local_e0.state].nbAdditionalBits;
      bVar3 = local_f0.table[local_f0.state].nbAdditionalBits;
      if (bVar3 == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = ((local_128.bitContainer << (local_128._8_8_ & 0x3f)) >>
                 ((ulong)(byte)-bVar3 & 0x3f)) + (ulong)local_f0.table[local_f0.state].baseValue;
        local_128.bitsConsumed = local_128.bitsConsumed + bVar3;
      }
      if (bVar3 < 2) {
        lVar8 = uVar16 + ((ulong)local_100.table[local_100.state].baseValue == 0);
        if (lVar8 != 0) {
          if (lVar8 == 3) {
            uVar15 = local_d0[0] - 1;
          }
          else {
            uVar15 = local_d0[lVar8];
          }
          if (lVar8 != 1) {
            local_d0[2] = local_d0[1];
          }
          local_d0[1] = local_d0[0];
          local_d0[0] = uVar15 + (uVar15 == 0);
        }
      }
      else {
        local_d0[1] = local_d0[0];
        local_d0[2] = uVar15;
        local_d0[0] = uVar16;
      }
      if (bVar2 == 0) {
        uVar15 = 0;
      }
      else {
        uVar15 = (local_128.bitContainer << (local_128._8_8_ & 0x3f)) >>
                 ((ulong)(byte)-bVar2 & 0x3f);
        local_128.bitsConsumed = local_128.bitsConsumed + bVar2;
      }
      if ((0x1e < (uint)bVar2 + (uint)bVar1 + (uint)bVar3) && (local_128.bitsConsumed < 0x41)) {
        if (local_128.ptr < local_128.limitPtr) {
          if (local_128.ptr != local_128.start) {
            uVar16 = (ulong)(uint)((int)local_128.ptr - iVar13);
            if (local_128.start <=
                (ulong *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3))) {
              uVar16 = (ulong)(local_128.bitsConsumed >> 3);
            }
            local_128.ptr = (char *)((long)local_128.ptr - uVar16);
            local_128.bitsConsumed = local_128.bitsConsumed + (int)uVar16 * -8;
            local_128.bitContainer = *(size_t *)local_128.ptr;
          }
        }
        else {
          local_128.ptr = (char *)((long)local_128.ptr - (ulong)(local_128.bitsConsumed >> 3));
          local_128._8_8_ = local_128._8_8_ & 0xffffffff00000007;
          local_128.bitContainer = *(size_t *)local_128.ptr;
        }
      }
      if (bVar1 == 0) {
        local_80 = 0;
      }
      else {
        local_80 = (local_128.bitContainer << (local_128._8_8_ & 0x3f)) >>
                   ((ulong)(byte)-bVar1 & 0x3f);
        local_128.bitsConsumed = local_128.bitsConsumed + bVar1;
      }
      sStack_78 = uVar15 + local_e0.table[local_e0.state].baseValue;
      local_80 = local_80 + local_100.table[local_100.state].baseValue;
      iVar13 = local_128.bitsConsumed + local_100.table[local_100.state].nbBits;
      local_100.state =
           (ulong)((uint)(local_128.bitContainer >> ((ulong)(byte)-(char)iVar13 & 0x3f)) &
                  BIT_mask[local_100.table[local_100.state].nbBits]) +
           (ulong)local_100.table[local_100.state].nextState;
      iVar13 = iVar13 + (uint)local_e0.table[local_e0.state].nbBits;
      local_e0.state =
           (ulong)((uint)(local_128.bitContainer >> ((ulong)(byte)-(char)iVar13 & 0x3f)) &
                  BIT_mask[local_e0.table[local_e0.state].nbBits]) +
           (ulong)local_e0.table[local_e0.state].nextState;
      iVar13 = iVar13 + (uint)local_f0.table[local_f0.state].nbBits;
      local_128._8_8_ = CONCAT44(local_128._12_4_,iVar13);
      local_f0.state =
           (ulong)((uint)(local_128.bitContainer >> ((ulong)(byte)-(char)iVar13 & 0x3f)) &
                  BIT_mask[local_f0.table[local_f0.state].nbBits]) +
           (ulong)local_f0.table[local_f0.state].nextState;
      local_70 = local_d0[0];
      pZVar17 = (ZSTD_DCtx *)(sStack_78 + local_80);
      pBVar5 = (BYTE *)((long)dst + (long)pZVar17);
      pZVar9 = (ZSTD_DCtx *)0xffffffffffffffba;
      if (pBVar5 <= local_a0) {
        pBVar11 = local_130 + local_80;
        pZVar9 = (ZSTD_DCtx *)0xffffffffffffffec;
        if (pBVar11 <= local_88) {
          pBVar14 = (BYTE *)((long)dst + local_80);
          if (local_90 < pBVar14) {
            sequence.matchLength = sStack_78;
            sequence.litLength = local_80;
            sequence.offset = local_d0[0];
            sequence.match = pBStack_68;
            pZVar9 = (ZSTD_DCtx *)
                     ZSTD_execSequenceLast7
                               ((BYTE *)dst,local_a0,sequence,&local_130,local_88,local_98,local_58,
                                local_60);
          }
          else {
            *(undefined8 *)dst = *(undefined8 *)local_130;
            if (8 < local_80) {
              pBVar10 = (BYTE *)((long)dst + 8);
              do {
                local_130 = local_130 + 8;
                *(undefined8 *)pBVar10 = *(undefined8 *)local_130;
                pBVar10 = pBVar10 + 8;
              } while (pBVar10 < (BYTE *)((long)dst + local_80));
            }
            pBVar10 = pBVar14 + -local_d0[0];
            local_130 = pBVar11;
            if (local_d0[0] <= (ulong)((long)pBVar14 - (long)local_98)) goto LAB_00151ea5;
            if (local_d0[0] <= (ulong)((long)pBVar14 - (long)local_58)) {
              lVar8 = (long)(pBVar14 + -local_d0[0]) - (long)local_98;
              pBVar11 = local_60 + lVar8;
              if (local_60 < pBVar11 + sStack_78) {
                memmove(pBVar14,pBVar11,-lVar8);
                pBVar14 = pBVar14 + -lVar8;
                sStack_78 = lVar8 + sStack_78;
                pBVar10 = pBVar18;
                if (sStack_78 < 3 || local_90 < pBVar14) {
                  if (sStack_78 != 0) {
                    uVar15 = 0;
                    do {
                      pBVar14[uVar15] = pBVar18[uVar15];
                      uVar15 = uVar15 + 1;
                    } while ((uVar15 & 0xffffffff) < sStack_78);
                  }
                  pZVar9 = pZVar17;
                  if (sStack_78 < 3 || local_90 < pBVar14) goto LAB_00151f81;
                }
LAB_00151ea5:
                if (local_70 < 8) {
                  iVar13 = *(int *)(ZSTD_execSequence_dec64table + local_70 * 4);
                  *pBVar14 = *pBVar10;
                  pBVar14[1] = pBVar10[1];
                  pBVar14[2] = pBVar10[2];
                  pBVar14[3] = pBVar10[3];
                  pBVar18 = pBVar10 + *(uint *)(ZSTD_execSequence_dec32table + local_70 * 4);
                  pBVar10 = pBVar10 + ((ulong)*(uint *)(ZSTD_execSequence_dec32table + local_70 * 4)
                                      - (long)iVar13);
                  *(undefined4 *)(pBVar14 + 4) = *(undefined4 *)pBVar18;
                }
                else {
                  *(undefined8 *)pBVar14 = *(undefined8 *)pBVar10;
                }
                pBVar18 = pBVar14 + 8;
                pBVar10 = pBVar10 + 8;
                if (local_48 < pBVar5) {
                  pBVar11 = pBVar18;
                  pBVar14 = pBVar10;
                  if (pBVar18 < local_90) {
                    do {
                      *(undefined8 *)pBVar11 = *(undefined8 *)pBVar14;
                      pBVar11 = pBVar11 + 8;
                      pBVar14 = pBVar14 + 8;
                    } while (pBVar11 < local_90);
                    pBVar10 = pBVar10 + ((long)local_90 - (long)pBVar18);
                    pBVar18 = local_90;
                  }
                  for (; pZVar9 = pZVar17, pBVar18 < pBVar5; pBVar18 = pBVar18 + 1) {
                    BVar4 = *pBVar10;
                    pBVar10 = pBVar10 + 1;
                    *pBVar18 = BVar4;
                  }
                }
                else {
                  do {
                    *(undefined8 *)pBVar18 = *(undefined8 *)pBVar10;
                    pBVar18 = pBVar18 + 8;
                    pBVar10 = pBVar10 + 8;
                    pZVar9 = pZVar17;
                  } while (pBVar18 < pBVar14 + sStack_78);
                }
              }
              else {
                memmove(pBVar14,pBVar11,sStack_78);
                pZVar9 = pZVar17;
              }
            }
          }
        }
      }
LAB_00151f81:
      bVar7 = false;
      pZVar17 = (ZSTD_DCtx *)0x0;
      if (pZVar9 < (ZSTD_DCtx *)0xffffffffffffff89) {
        pZVar17 = pZVar9;
      }
      dst = (void *)((long)dst + (long)pZVar17);
      dctx = local_38;
      pBVar18 = local_88;
      nbSeq = nbSeq + -1;
    } while (pZVar9 < (ZSTD_DCtx *)0xffffffffffffff89);
  }
  if (!bVar7) {
    return (size_t)pZVar9;
  }
LAB_00152009:
  uVar15 = (long)pBVar18 - (long)local_130;
  if ((ulong)((long)local_a0 - (long)dst) < uVar15) {
    pBVar18 = (BYTE *)0xffffffffffffffba;
  }
  else {
    memcpy(dst,local_130,uVar15);
    pBVar18 = (BYTE *)((long)dst + (uVar15 - (long)local_40));
  }
  return (size_t)pBVar18;
}

Assistant:

size_t
ZSTD_decompressSequences_bmi2(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}